

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O0

int lj_cf_debug_gethook(lua_State *L)

{
  int mask_00;
  lua_State *L_00;
  lua_State *in_RDI;
  lua_Hook hook;
  int mask;
  char buff [5];
  lua_Integer in_stack_ffffffffffffffc8;
  lua_State *L_01;
  void *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  char local_d [5];
  lua_State *local_8;
  
  local_8 = in_RDI;
  mask_00 = lua_gethookmask(in_RDI);
  L_00 = (lua_State *)lua_gethook(local_8);
  if ((L_00 == (lua_State *)0x0) || (L_00 == (lua_State *)hookf)) {
    lua_pushlightuserdata(L_00,in_stack_ffffffffffffffd8);
    lua_rawget((lua_State *)CONCAT44(mask_00,in_stack_ffffffffffffffe8),(int)((ulong)L_00 >> 0x20));
  }
  else {
    lua_pushlstring((lua_State *)CONCAT44(mask_00,in_stack_ffffffffffffffe8),(char *)L_00,
                    (size_t)in_stack_ffffffffffffffd8);
  }
  L_01 = local_8;
  unmakemask(mask_00,local_d);
  lua_pushstring((lua_State *)CONCAT44(mask_00,in_stack_ffffffffffffffe8),(char *)L_00);
  lua_gethookcount(local_8);
  lua_pushinteger(L_01,in_stack_ffffffffffffffc8);
  return 3;
}

Assistant:

LJLIB_CF(debug_gethook)
{
  char buff[5];
  int mask = lua_gethookmask(L);
  lua_Hook hook = lua_gethook(L);
  if (hook != NULL && hook != hookf) {  /* external hook? */
    lua_pushliteral(L, "external hook");
  } else {
    lua_pushlightuserdata(L, (void *)&KEY_HOOK);
    lua_rawget(L, LUA_REGISTRYINDEX);   /* get hook */
  }
  lua_pushstring(L, unmakemask(mask, buff));
  lua_pushinteger(L, lua_gethookcount(L));
  return 3;
}